

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlink.c
# Opt level: O3

xlinkType xlinkIsLink(xmlDocPtr doc,xmlNodePtr node)

{
  int iVar1;
  xmlChar *str1;
  xmlChar *str1_00;
  xmlNsPtr pxVar2;
  xlinkType xVar3;
  char *str2;
  xmlChar buf [200];
  xmlChar axStack_f8 [199];
  undefined1 local_31;
  
  str2 = (char *)axStack_f8;
  xVar3 = XLINK_TYPE_NONE;
  if (node == (xmlNodePtr)0x0) {
    return XLINK_TYPE_NONE;
  }
  if ((doc == (xmlDocPtr)0x0) && (doc = node->doc, doc == (_xmlDoc *)0x0)) {
    doc = (_xmlDoc *)0x0;
  }
  else if (doc->type == XML_HTML_DOCUMENT_NODE) goto LAB_001c694b;
  if (node->ns != (xmlNs *)0x0) {
    xmlStrEqual(node->ns->href,(xmlChar *)"http://www.w3.org/1999/xhtml/");
  }
LAB_001c694b:
  str1 = xmlGetNsProp(node,"type",(xmlChar *)"http://www.w3.org/1999/xlink/namespace/");
  if (str1 != (xmlChar *)0x0) {
    iVar1 = xmlStrEqual(str1,"simple");
    xVar3 = XLINK_TYPE_SIMPLE;
    if (iVar1 == 0) {
      iVar1 = xmlStrEqual(str1,(xmlChar *)"extended");
      if (iVar1 == 0) {
        xVar3 = XLINK_TYPE_NONE;
      }
      else {
        str1_00 = xmlGetNsProp(node,(xmlChar *)"role",
                               (xmlChar *)"http://www.w3.org/1999/xlink/namespace/");
        if (str1_00 != (xmlChar *)0x0) {
          pxVar2 = xmlSearchNs(doc,node,(xmlChar *)"http://www.w3.org/1999/xlink/namespace/");
          if (pxVar2 == (xmlNsPtr)0x0) {
            str2 = "xlink:external-linkset";
          }
          else {
            snprintf((char *)axStack_f8,200,"%s:external-linkset",pxVar2->prefix);
            local_31 = 0;
          }
          xmlStrEqual(str1_00,(xmlChar *)str2);
          (*xmlFree)(str1);
          (*xmlFree)(str1_00);
          return XLINK_TYPE_EXTENDED;
        }
        xVar3 = XLINK_TYPE_EXTENDED;
      }
    }
    (*xmlFree)(str1);
  }
  return xVar3;
}

Assistant:

xlinkType
xlinkIsLink	(xmlDocPtr doc, xmlNodePtr node) {
    xmlChar *type = NULL, *role = NULL;
    xlinkType ret = XLINK_TYPE_NONE;

    if (node == NULL) return(XLINK_TYPE_NONE);
    if (doc == NULL) doc = node->doc;
    if ((doc != NULL) && (doc->type == XML_HTML_DOCUMENT_NODE)) {
        /*
	 * This is an HTML document.
	 */
    } else if ((node->ns != NULL) &&
               (xmlStrEqual(node->ns->href, XHTML_NAMESPACE))) {
	/*
	 * !!!! We really need an IS_XHTML_ELEMENT function from HTMLtree.h @@@
	 */
        /*
	 * This is an XHTML element within an XML document
	 * Check whether it's one of the element able to carry links
	 * and in that case if it holds the attributes.
	 */
    }

    /*
     * We don't prevent a-priori having XML Linking constructs on
     * XHTML elements
     */
    type = xmlGetNsProp(node, BAD_CAST"type", XLINK_NAMESPACE);
    if (type != NULL) {
	if (xmlStrEqual(type, BAD_CAST "simple")) {
            ret = XLINK_TYPE_SIMPLE;
	} else if (xmlStrEqual(type, BAD_CAST "extended")) {
	    role = xmlGetNsProp(node, BAD_CAST "role", XLINK_NAMESPACE);
	    if (role != NULL) {
		xmlNsPtr xlink;
		xlink = xmlSearchNs(doc, node, XLINK_NAMESPACE);
		if (xlink == NULL) {
		    /* Humm, fallback method */
		    if (xmlStrEqual(role, BAD_CAST"xlink:external-linkset"))
			ret = XLINK_TYPE_EXTENDED_SET;
		} else {
		    xmlChar buf[200];
		    snprintf((char *) buf, sizeof(buf), "%s:external-linkset",
			     (char *) xlink->prefix);
                    buf[sizeof(buf) - 1] = 0;
		    if (xmlStrEqual(role, buf))
			ret = XLINK_TYPE_EXTENDED_SET;

		}

	    }
	    ret = XLINK_TYPE_EXTENDED;
	}
    }

    if (type != NULL) xmlFree(type);
    if (role != NULL) xmlFree(role);
    return(ret);
}